

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O0

void StoreDiffusionErrors(VP8EncIterator *it,VP8ModeScore *rd)

{
  int8_t (*paiVar1) [2];
  int8_t (*paiVar2) [2];
  int8_t *left;
  int8_t *top;
  int ch;
  VP8ModeScore *rd_local;
  VP8EncIterator *it_local;
  
  for (ch = 0; ch < 2; ch = ch + 1) {
    paiVar1 = it->top_derr[it->x] + ch;
    paiVar2 = it->left_derr + ch;
    (*paiVar2)[0] = rd->derr[ch][0];
    (*paiVar2)[1] = (int8_t)(rd->derr[ch][2] * 3 >> 2);
    (*paiVar1)[0] = rd->derr[ch][1];
    (*paiVar1)[1] = rd->derr[ch][2] - (*paiVar2)[1];
  }
  return;
}

Assistant:

static void StoreDiffusionErrors(VP8EncIterator* WEBP_RESTRICT const it,
                                 const VP8ModeScore* WEBP_RESTRICT const rd) {
  int ch;
  for (ch = 0; ch <= 1; ++ch) {
    int8_t* const top = it->top_derr[it->x][ch];
    int8_t* const left = it->left_derr[ch];
    left[0] = rd->derr[ch][0];            // restore err1
    left[1] = 3 * rd->derr[ch][2] >> 2;   //     ... 3/4th of err3
    top[0]  = rd->derr[ch][1];            //     ... err2
    top[1]  = rd->derr[ch][2] - left[1];  //     ... 1/4th of err3.
  }
}